

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void dw4_cristo(dw_rom *rom)

{
  ulong in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  ulong in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  ulong in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  ulong in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  ulong in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  ulong in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  ulong in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  ulong in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  ulong in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  ulong in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  ulong in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  ulong in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  ulong in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  ulong in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  ulong in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  ulong in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  ulong in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  ulong in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  ulong in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  ulong in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  ulong in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  ulong in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  ulong in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  ulong in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  ulong in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  ulong in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  ulong in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  ulong in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  ulong in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  ulong in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  ulong in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,in_stack_fffffffffffffd68 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffd70 >> 0x20),0x52),
         in_stack_fffffffffffffd78 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffd80 >> 0x20),0x53),
         in_stack_fffffffffffffd88 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffd90 >> 0x20),0x54),
         in_stack_fffffffffffffd98 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffda0 >> 0x20),0x55),
         in_stack_fffffffffffffda8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),0x56),
         in_stack_fffffffffffffdb8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),0x57),
         in_stack_fffffffffffffdc8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),0x50),
         in_stack_fffffffffffffdd8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),0x51),
         in_stack_fffffffffffffde8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),0x52),
         in_stack_fffffffffffffdf8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe00 >> 0x20),0x53),
         in_stack_fffffffffffffe08 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe10 >> 0x20),0x54),
         in_stack_fffffffffffffe18 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),0x55),
         in_stack_fffffffffffffe28 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe30 >> 0x20),0x56),
         in_stack_fffffffffffffe38 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe40 >> 0x20),0x57),
         in_stack_fffffffffffffe48 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),0x50),
         in_stack_fffffffffffffe58 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe60 >> 0x20),0x51),
         in_stack_fffffffffffffe68 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe70 >> 0x20),0x52),
         in_stack_fffffffffffffe78 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe80 >> 0x20),0x53),
         in_stack_fffffffffffffe88 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),0x54),
         in_stack_fffffffffffffe98 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffea0 >> 0x20),0x55),
         in_stack_fffffffffffffea8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),0x56),
         in_stack_fffffffffffffeb8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffec0 >> 0x20),0x57),
         in_stack_fffffffffffffec8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),0x50),
         in_stack_fffffffffffffed8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),0x51),
         in_stack_fffffffffffffee8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),0x52),
         in_stack_fffffffffffffef8 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),0x53),
         in_stack_ffffffffffffff08 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff10 >> 0x20),0x54),
         in_stack_ffffffffffffff18 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),0x55),
         in_stack_ffffffffffffff28 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),0x56),
         in_stack_ffffffffffffff38 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),0x57),
         in_stack_ffffffffffffff48 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),0x50));
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1a8b,2,0x30,0x1a);
  vpatch(rom,0x12300,0x80,0x43,0x47,0x47,0x47,0x47,0x5f,0x5f,0x5f,4,8,9,8,0xf,0x1b,0x1a,10,0xc0,0xe0
         ,0xe0,0xe0,0xe0,0xf8,0xf8,0xf0,0x20,0x10,0x90,0x10,0xf0,0xd8,0x58,0x50,0xe7,0xf7,0xf2,1,
         0x1f,0,0xe,0,0xbc,0xeb,0x8d,0x1e,1,0x1f,0x31,0,0xe0,0xcc,0xc,0xc,0xfc,0,0,0xf0,0x38,0xf0,
         0xf0,0xf0,0x80,0xf8,0xfc,0,3);
  vpatch(rom,0x12400,0x180,0x26,0x2e,0x2e,0x2e,0x2f,0x3f,0x2f,0x2f,1,1,9,1,0xf,0x19,5,5,0,0,0,0,0,
         0xf8,0xf8,0xf0,0xe0,0xf0,0xf0,0xf0,0xf0,0xf8,0x78,0x70,0x7f,0x77,0x78,0x34,0xf,0,0,0xf,0x71
         ,0x47,0x47,0x2b,8,0xf,0x1f,0,0x80,0x70,0x38,0x78,0xf0,0,0,0,0xe0,0x80,0xc0,0x80,0,0xf0,0xf8
         ,0,6);
  return;
}

Assistant:

static void dw4_cristo(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01a8b,    2,  0x30,  0x1a);
    vpatch(rom, 0x12300,  128,  0x43,  0x47,  0x47,  0x47,  0x47,  0x5f,  0x5f,  0x5f,  0x04,  0x08,  0x09,  0x08,  0x0f,  0x1b,  0x1a,  0x0a,  0xc0,  0xe0,  0xe0,  0xe0,  0xe0,  0xf8,  0xf8,  0xf0,  0x20,  0x10,  0x90,  0x10,  0xf0,  0xd8,  0x58,  0x50,  0xe7,  0xf7,  0xf2,  0x01,  0x1f,  0x00,  0x0e,  0x00,  0xbc,  0xeb,  0x8d,  0x1e,  0x01,  0x1f,  0x31,  0x00,  0xe0,  0xcc,  0x0c,  0x0c,  0xfc,  0x00,  0x00,  0xf0,  0x38,  0xf0,  0xf0,  0xf0,  0x80,  0xf8,  0xfc,  0x00,  0x03,  0x07,  0x07,  0x07,  0x47,  0x5f,  0x5f,  0x5f,  0x04,  0x08,  0x09,  0x08,  0x0f,  0x1b,  0x18,  0x0a,  0xc0,  0xe0,  0xe0,  0xe0,  0xe0,  0xf8,  0xf8,  0xf0,  0x20,  0x10,  0x90,  0x10,  0xf0,  0xd8,  0x18,  0x50,  0x67,  0xf7,  0xf2,  0xe1,  0x5f,  0x00,  0x00,  0x0f,  0x1c,  0xab,  0xad,  0xfe,  0x41,  0x1f,  0x3f,  0x00,  0xe4,  0xdc,  0x1c,  0x00,  0xf8,  0x00,  0x70,  0x00,  0x38,  0xe0,  0xe0,  0xf8,  0x80,  0xf8,  0x8c,  0x00);
    vpatch(rom, 0x12400,  384,  0x26,  0x2e,  0x2e,  0x2e,  0x2f,  0x3f,  0x2f,  0x2f,  0x01,  0x01,  0x09,  0x01,  0x0f,  0x19,  0x05,  0x05,  0x00,  0x00,  0x00,  0x00,  0x00,  0xf8,  0xf8,  0xf0,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0x78,  0x70,  0x7f,  0x77,  0x78,  0x34,  0x0f,  0x00,  0x00,  0x0f,  0x71,  0x47,  0x47,  0x2b,  0x08,  0x0f,  0x1f,  0x00,  0x80,  0x70,  0x38,  0x78,  0xf0,  0x00,  0x00,  0x00,  0xe0,  0x80,  0xc0,  0x80,  0x00,  0xf0,  0xf8,  0x00,  0x06,  0x0e,  0x0e,  0x0e,  0x8f,  0xdf,  0x6f,  0x3f,  0x01,  0x01,  0x09,  0x01,  0x0f,  0x19,  0x01,  0x05,  0x00,  0x00,  0x00,  0x00,  0x00,  0xf8,  0xf8,  0xf0,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0x78,  0x70,  0x1f,  0x0f,  0x0b,  0x05,  0x0f,  0x00,  0x00,  0x00,  0x01,  0x04,  0x04,  0x0a,  0x08,  0x0f,  0x1f,  0x00,  0x80,  0x60,  0xe0,  0xc0,  0xf0,  0x00,  0x00,  0xf0,  0xe0,  0x90,  0x10,  0x30,  0x00,  0xf0,  0xf8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x1f,  0x1f,  0x0f,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x1e,  0x0e,  0x64,  0x74,  0x74,  0x74,  0xf4,  0xfc,  0xf4,  0xf4,  0x80,  0x80,  0x90,  0x80,  0xf0,  0x98,  0xa0,  0xa0,  0x03,  0x06,  0x0c,  0x18,  0x3f,  0x20,  0x00,  0x00,  0x05,  0x09,  0x03,  0x07,  0x00,  0x0f,  0x1f,  0x00,  0xfe,  0xee,  0xfe,  0x7c,  0xf0,  0x00,  0x00,  0xf0,  0x8e,  0xe2,  0x02,  0x84,  0x10,  0xf0,  0xf8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x1f,  0x1f,  0x0f,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x1e,  0x0e,  0x60,  0x70,  0x70,  0x70,  0xf1,  0xfb,  0xf6,  0xfc,  0x80,  0x80,  0x90,  0x80,  0xf0,  0x98,  0x80,  0xa0,  0x03,  0x06,  0x0f,  0x1b,  0x3d,  0x20,  0x00,  0x0f,  0x05,  0x09,  0x00,  0x04,  0x02,  0x0f,  0x1f,  0x00,  0xf8,  0x30,  0xe0,  0xc0,  0xf0,  0x80,  0x00,  0x00,  0x80,  0xc0,  0x90,  0x70,  0x50,  0xf0,  0xf8,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x18,  0x1f,  0x0f,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x1f,  0x0f,  0x02,  0x02,  0x02,  0x02,  0x02,  0x1a,  0xfa,  0xf2,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf0,  0x07,  0x30,  0x30,  0x30,  0x3f,  0x03,  0x0f,  0x00,  0x1f,  0x0f,  0x0f,  0x0f,  0x00,  0x1c,  0x30,  0x00,  0xff,  0x3f,  0x77,  0xe2,  0xfa,  0x80,  0x00,  0xf0,  0xe7,  0xc1,  0x89,  0x1a,  0x02,  0x78,  0xfc,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x18,  0x1f,  0x0f,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x1f,  0x0f,  0x00,  0x00,  0x00,  0x00,  0x02,  0x1a,  0xfa,  0xf2,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf0,  0x67,  0x70,  0x20,  0x00,  0x1f,  0x03,  0x03,  0x0f,  0x1f,  0x0f,  0x1f,  0x1f,  0x00,  0x1c,  0x3c,  0x00,  0xfa,  0x3f,  0x7f,  0xef,  0xfa,  0x80,  0x70,  0x00,  0xe0,  0xc7,  0x81,  0x11,  0x02,  0x78,  0x8c,  0x00);
}